

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall
capnp::DynamicStruct::Builder::set
          (Builder *this,StringPtr name,initializer_list<capnp::DynamicValue::Reader> value)

{
  undefined1 local_128 [8];
  Reader element;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<capnp::DynamicValue::Reader> *__range1;
  uint i;
  Builder local_a8;
  undefined1 local_68 [8];
  BuilderFor<capnp::DynamicList> list;
  Builder *this_local;
  initializer_list<capnp::DynamicValue::Reader> value_local;
  StringPtr name_local;
  
  value_local._M_array = (iterator)value._M_len;
  this_local = (Builder *)value._M_array;
  value_local._M_len = (size_type)name.content.ptr;
  list.builder._32_8_ = this;
  std::initializer_list<capnp::DynamicValue::Reader>::size
            ((initializer_list<capnp::DynamicValue::Reader> *)&this_local);
  init((Builder *)&local_a8,(EVP_PKEY_CTX *)this);
  DynamicValue::Builder::as<capnp::DynamicList>
            ((BuilderFor<capnp::DynamicList> *)local_68,&local_a8);
  DynamicValue::Builder::~Builder(&local_a8);
  __range1._0_4_ = 0;
  __end1 = std::initializer_list<capnp::DynamicValue::Reader>::begin
                     ((initializer_list<capnp::DynamicValue::Reader> *)&this_local);
  element.field_1._56_8_ =
       std::initializer_list<capnp::DynamicValue::Reader>::end
                 ((initializer_list<capnp::DynamicValue::Reader> *)&this_local);
  for (; __end1 != element.field_1._56_8_; __end1 = __end1 + 1) {
    DynamicValue::Reader::Reader((Reader *)local_128,__end1);
    DynamicList::Builder::set((Builder *)local_68,(uint)__range1,(Reader *)local_128);
    DynamicValue::Reader::~Reader((Reader *)local_128);
    __range1._0_4_ = (uint)__range1 + 1;
  }
  return;
}

Assistant:

void DynamicStruct::Builder::set(kj::StringPtr name,
                                 std::initializer_list<DynamicValue::Reader> value) {
  auto list = init(name, value.size()).as<DynamicList>();
  uint i = 0;
  for (auto element: value) {
    list.set(i++, element);
  }
}